

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O3

QuotingType __thiscall llvm::yaml::needsQuotes(yaml *this,StringRef S)

{
  yaml yVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_t extraout_RDX;
  char *pcVar5;
  QuotingType QVar6;
  uint uVar7;
  StringRef S_00;
  StringRef Chars;
  undefined1 local_38 [8];
  StringRef S_local;
  
  S_00.Data = S.Data;
  QVar6 = Single;
  if (S_00.Data != (char *)0x0) {
    yVar1 = *this;
    local_38 = (undefined1  [8])this;
    S_local.Data = S_00.Data;
    iVar3 = isspace((uint)(byte)yVar1);
    if ((iVar3 == 0) && (iVar3 = isspace((uint)(byte)(this + -1)[(long)S_00.Data]), iVar3 == 0)) {
      if (S_00.Data == &DAT_00000001) {
        if (yVar1 == (yaml)0x7e) {
          return Single;
        }
      }
      else if (S_00.Data == (char *)0x5) {
        if (this[4] == (yaml)0x65 && *(int *)this == 0x736c6166) {
          return Single;
        }
        if (this[4] == (yaml)0x65 && *(int *)this == 0x736c6146) {
          return Single;
        }
        if (this[4] == (yaml)0x45 && *(int *)this == 0x534c4146) {
          return Single;
        }
      }
      else if (S_00.Data == (char *)0x4) {
        if (*(int *)this == 0x6c6c756e) {
          return Single;
        }
        if (*(int *)this == 0x6c6c754e) {
          return Single;
        }
        if (*(int *)this == 0x4c4c554e) {
          return Single;
        }
        if (*(int *)this == 0x65757274) {
          return Single;
        }
        if (*(int *)this == 0x65757254) {
          return Single;
        }
        if (*(int *)this == 0x45555254) {
          return Single;
        }
      }
      S_00.Length = extraout_RDX;
      bVar2 = isNumeric(this,S_00);
      if (((!bVar2) &&
          (Chars.Length = 0x14, Chars.Data = "-?:\\,[]{}#&*!|>\'\"%@`",
          sVar4 = StringRef::find_first_of((StringRef *)local_38,Chars,0), sVar4 != 0)) &&
         (QVar6 = None, S_local.Data != (char *)0x0)) {
        pcVar5 = (char *)0x0;
        QVar6 = None;
        do {
          yVar1 = *(yaml *)((long)local_38 + (long)pcVar5);
          if ((9 < (byte)((char)yVar1 - 0x30U)) && (0x19 < (byte)(((byte)yVar1 & 0xdf) + 0xbf))) {
            uVar7 = (uint)(byte)yVar1;
            if ((byte)yVar1 < 0x2f) {
              if ((0x700100000200U >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
                if ((0x2400UL >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_00b18083;
                QVar6 = Single;
              }
            }
            else {
LAB_00b18083:
              if (1 < (byte)yVar1 - 0x5e) {
                if (uVar7 == 0x7f) {
                  return Double;
                }
                QVar6 = Single;
                if ((char)yVar1 < ' ') {
                  return Double;
                }
              }
            }
          }
          pcVar5 = pcVar5 + 1;
        } while (S_local.Data != pcVar5);
      }
    }
  }
  return QVar6;
}

Assistant:

inline QuotingType needsQuotes(StringRef S) {
  if (S.empty())
    return QuotingType::Single;
  if (isspace(static_cast<unsigned char>(S.front())) ||
      isspace(static_cast<unsigned char>(S.back())))
    return QuotingType::Single;
  if (isNull(S))
    return QuotingType::Single;
  if (isBool(S))
    return QuotingType::Single;
  if (isNumeric(S))
    return QuotingType::Single;

  // 7.3.3 Plain Style
  // Plain scalars must not begin with most indicators, as this would cause
  // ambiguity with other YAML constructs.
  static constexpr char Indicators[] = R"(-?:\,[]{}#&*!|>'"%@`)";
  if (S.find_first_of(Indicators) == 0)
    return QuotingType::Single;

  QuotingType MaxQuotingNeeded = QuotingType::None;
  for (unsigned char C : S) {
    // Alphanum is safe.
    if (isAlnum(C))
      continue;

    switch (C) {
    // Safe scalar characters.
    case '_':
    case '-':
    case '^':
    case '.':
    case ',':
    case ' ':
    // TAB (0x9) is allowed in unquoted strings.
    case 0x9:
      continue;
    // LF(0xA) and CR(0xD) may delimit values and so require at least single
    // quotes.
    case 0xA:
    case 0xD:
      MaxQuotingNeeded = QuotingType::Single;
      continue;
    // DEL (0x7F) are excluded from the allowed character range.
    case 0x7F:
      return QuotingType::Double;
    // Forward slash is allowed to be unquoted, but we quote it anyway.  We have
    // many tests that use FileCheck against YAML output, and this output often
    // contains paths.  If we quote backslashes but not forward slashes then
    // paths will come out either quoted or unquoted depending on which platform
    // the test is run on, making FileCheck comparisons difficult.
    case '/':
    default: {
      // C0 control block (0x0 - 0x1F) is excluded from the allowed character
      // range.
      if (C <= 0x1F)
        return QuotingType::Double;

      // Always double quote UTF-8.
      if ((C & 0x80) != 0)
        return QuotingType::Double;

      // The character is not safe, at least simple quoting needed.
      MaxQuotingNeeded = QuotingType::Single;
    }
    }
  }

  return MaxQuotingNeeded;
}